

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  size_t *__k;
  int iVar1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar2;
  char cVar3;
  int iVar4;
  istream *this;
  ostream *poVar5;
  mapped_type *pmVar6;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar7;
  long lVar8;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar9;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar10;
  pointer pcVar11;
  long lVar12;
  ulong uVar13;
  undefined1 local_f8 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> char2index;
  long local_b8 [2];
  size_type *local_a8;
  string line;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  letters;
  int local_64;
  long lStack_60;
  int width;
  size_type *local_58;
  string text;
  int height;
  
  local_58 = &text._M_string_length;
  text._M_dataplus._M_p = (pointer)0x0;
  text._M_string_length._0_1_ = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_64);
  std::istream::operator>>(this,(int *)(text.field_2._M_local_buf + 0xc));
  std::istream::ignore();
  cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x20);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_58,cVar3);
  line.field_2._8_8_ = 0;
  char2index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&char2index;
  char2index._M_t._M_impl._0_4_ = 0;
  char2index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  char2index._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  char2index._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  char2index._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       char2index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::resize((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)((long)&line.field_2 + 8),0x1b);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_58,(long)text._M_dataplus._M_p);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (0 < (int)text.field_2._12_4_) {
    lVar12 = 0;
    __k = &char2index._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      local_a8 = &line._M_string_length;
      line._M_dataplus._M_p = (pointer)0x0;
      line._M_string_length._0_1_ = 0;
      cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x20);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&local_a8,cVar3);
      if (line.field_2._8_8_ != 0) {
        lVar8 = 0;
        uVar13 = 0;
        do {
          if (lVar12 == 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(line.field_2._8_8_ + lVar8),(long)(int)text.field_2._12_4_);
            char2index._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
                 (int)"ABCDEFGHIJKLMNOPQRSTUVWXYZ?"[uVar13];
            pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)local_f8,(key_type *)__k);
            *pmVar6 = (mapped_type)uVar13;
          }
          std::__cxx11::string::substr((ulong)__k,(ulong)&local_a8);
          std::__cxx11::string::operator=
                    ((string *)(*(long *)(line.field_2._8_8_ + lVar8) + lVar12 * 0x20),(string *)__k
                    );
          if ((long *)CONCAT44(char2index._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                               (int)char2index._M_t._M_impl.super__Rb_tree_header._M_node_count) !=
              local_b8) {
            operator_delete((long *)CONCAT44(char2index._M_t._M_impl.super__Rb_tree_header.
                                             _M_node_count._4_4_,
                                             (int)char2index._M_t._M_impl.super__Rb_tree_header.
                                                  _M_node_count),local_b8[0] + 1);
          }
          uVar13 = uVar13 + 1;
          lVar8 = lVar8 + 0x18;
        } while (uVar13 < (ulong)(((long)-line.field_2._8_8_ >> 3) * -0x5555555555555555));
      }
      if (local_a8 != &line._M_string_length) {
        operator_delete(local_a8,CONCAT71(line._M_string_length._1_7_,
                                          (undefined1)line._M_string_length) + 1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (int)text.field_2._12_4_);
    if (0 < (int)text.field_2._12_4_) {
      lVar12 = 0;
      do {
        lVar8 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     *(char **)(*(long *)(line.field_2._8_8_ + lVar8) + lVar12 * 0x20),
                     *(long *)(*(long *)(line.field_2._8_8_ + lVar8) + 8 + lVar12 * 0x20));
          lVar8 = lVar8 + 0x18;
        } while (lVar8 != 0x288);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
        lVar12 = lVar12 + 1;
      } while (lVar12 < (int)text.field_2._12_4_);
      if (0 < (int)text.field_2._12_4_) {
        lStack_60 = 0;
        do {
          if (text._M_dataplus._M_p != (pointer)0x0) {
            lVar12 = lStack_60 * 0x20;
            pcVar11 = (pointer)0x0;
            do {
              iVar4 = toupper((int)*(char *)((long)local_58 + (long)pcVar11));
              local_a8 = (size_type *)CONCAT44(local_a8._4_4_,iVar4);
              if (char2index._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
LAB_0010269c:
                char2index._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0x3f;
                pmVar6 = std::
                         map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                       *)local_f8,
                                      (key_type *)
                                      &char2index._M_t._M_impl.super__Rb_tree_header._M_node_count);
                lVar8 = *(long *)(line.field_2._8_8_ + (long)*pmVar6 * 0x18);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,*(char **)(lVar8 + lVar12),
                           *(long *)(lVar8 + 8 + lVar12));
              }
              else {
                pmVar2 = (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)char2index._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
                pmVar10 = &char2index;
                do {
                  pmVar9 = pmVar10;
                  pmVar7 = pmVar2;
                  iVar1 = *(int *)&(pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
                  pmVar10 = pmVar7;
                  if (iVar1 < iVar4) {
                    pmVar10 = pmVar9;
                  }
                  pmVar2 = (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)(&(pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent)
                              [iVar1 < iVar4];
                } while (pmVar2 != (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)0x0);
                if (pmVar10 == &char2index) goto LAB_0010269c;
                if (iVar1 < iVar4) {
                  pmVar7 = pmVar9;
                }
                if (iVar4 < *(int *)&(pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right
                   ) goto LAB_0010269c;
                pmVar6 = std::
                         map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                       *)local_f8,(key_type *)&local_a8);
                lVar8 = *(long *)(line.field_2._8_8_ + (long)*pmVar6 * 0x18);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,*(char **)(lVar8 + lVar12),
                           *(long *)(lVar8 + 8 + lVar12));
              }
              pcVar11 = pcVar11 + 1;
            } while (pcVar11 < text._M_dataplus._M_p);
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          std::ostream::flush();
          lStack_60 = lStack_60 + 1;
        } while (lStack_60 < (int)text.field_2._12_4_);
      }
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_f8);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)((long)&line.field_2 + 8));
  if (local_58 != &text._M_string_length) {
    operator_delete(local_58,CONCAT71(text._M_string_length._1_7_,(undefined1)text._M_string_length)
                             + 1);
  }
  return 0;
}

Assistant:

int main()
{
        int width, height;
        std::string text;
        std::cin >> width >> height;
        std::cin.ignore();
        getline(std::cin, text);

        char chars[] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ?";
        std::vector<std::vector<std::string> > letters;
        std::map<int, int> char2index;
        letters.resize(strlen(chars));
        std::cerr << text << std::endl;
        for (int l = 0; l < height; l++)
        {
                std::string line;
                getline(std::cin, line);
                //std::cerr << line << std::endl;

                for (size_t c = 0; c < letters.size(); c++)
                {
                    if (0 == l)
                    {
                        letters[c].resize(height);
                        char2index[chars[c]] = c;
                    }
                    letters[c][l] = line.substr(c*width, width);
                }
        }

        for (int l = 0; l < height; l++)
        {
            for (size_t c = 0; c < strlen(chars); c++)
            {
                std::cerr << letters[c][l];
            }
            std::cerr << std::endl;
        }

        for (int i = 0; i < height; i++)
        {
            for (size_t j = 0; j < text.length(); j++)
            {
                int c = toupper(text[j]);
                if (char2index.find(c) != char2index.end())
                {
                    std::cout << letters[char2index[c]][i];
                } else
                {
                    std::cout << letters[char2index['?']][i];
                }
            }
            std::cout << std::endl;
        }

        return 0;
}